

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariables.cpp
# Opt level: O3

void __thiscall chrono::ChVariables::ChVariables(ChVariables *this,int m_ndof)

{
  long lVar1;
  int iVar2;
  
  this->_vptr_ChVariables = (_func_int **)&PTR__ChVariables_00b04a08;
  (this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->ndof = m_ndof;
  this->disabled = false;
  this->offset = 0;
  if (m_ndof < 1) {
    return;
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&(this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             (ulong)(uint)m_ndof);
  lVar1 = (this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  if (-1 < lVar1) {
    if (lVar1 != 0) {
      memset((this->qb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,lVar1 << 3);
    }
    iVar2 = (*this->_vptr_ChVariables[2])(this);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)iVar2);
    lVar1 = (this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (-1 < lVar1) {
      if (lVar1 == 0) {
        return;
      }
      memset((this->fb).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,lVar1 << 3);
      return;
    }
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

ChVariables::ChVariables(int m_ndof) : disabled(false), ndof(m_ndof), offset(0) {
    if (ndof > 0) {
        qb.setZero(Get_ndof());
        fb.setZero(Get_ndof());
    }
}